

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  char cVar6;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  iVar5 = 0;
  if ((*ptr == '\0') && (iVar5 = 0, ptr[1] == '-')) {
    pbVar1 = (byte *)(ptr + 2);
joined_r0x00594cc3:
    pbVar3 = pbVar1;
    lVar4 = (long)end - (long)pbVar3;
    if (lVar4 < 2) {
      return -1;
    }
    bVar2 = *pbVar3;
    if (bVar2 < 0xdc) {
      cVar6 = '\a';
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          cVar6 = *(char *)((long)enc[1].scanners + (ulong)pbVar3[1]);
        }
        else {
LAB_00594d21:
          cVar6 = '\x1d';
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      cVar6 = '\b';
    }
    else {
      if ((bVar2 != 0xff) || (pbVar3[1] < 0xfe)) goto LAB_00594d21;
      cVar6 = '\0';
    }
    ptr = (char *)pbVar3;
    switch(cVar6) {
    case '\0':
    case '\x01':
    case '\b':
      goto switchD_00594d35_caseD_0;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
switchD_00594d35_caseD_2:
      pbVar1 = pbVar3 + 2;
      goto joined_r0x00594cc3;
    case '\x06':
      if (lVar4 != 2) {
        pbVar1 = pbVar3 + 3;
        goto joined_r0x00594cc3;
      }
      break;
    case '\a':
      if (3 < lVar4) {
        pbVar1 = pbVar3 + 4;
        goto joined_r0x00594cc3;
      }
      break;
    default:
      if (cVar6 != '\x1b') goto switchD_00594d35_caseD_2;
      pbVar1 = pbVar3 + 2;
      if ((long)end - (long)pbVar1 < 2) {
        return -1;
      }
      if ((*pbVar1 != 0) || (pbVar3[3] != 0x2d)) goto joined_r0x00594cc3;
      ptr = (char *)(pbVar3 + 4);
      if ((long)end - (long)ptr < 2) {
        return -1;
      }
      iVar5 = 0;
      if (*ptr == 0) {
        if (pbVar3[5] == 0x3e) {
          ptr = (char *)(pbVar3 + 6);
        }
        iVar5 = 0xd;
        if (pbVar3[5] != 0x3e) {
          iVar5 = 0;
        }
      }
      goto switchD_00594d35_caseD_0;
    }
    return -2;
  }
switchD_00594d35_caseD_0:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  if (HAS_CHAR(enc, ptr, end)) {
    if (! CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}